

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::Read
          (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
           *this,TPZStream *str,void *context)

{
  MElementType eltype;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  int refpatternindex;
  int local_1c;
  
  TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::Read
            (&this->
              super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
             ,str,context);
  TPZStream::Read<long>(str,&this->fSubEl,(void *)0x0);
  (*str->_vptr_TPZStream[0x1d])(str,&local_1c,1);
  if (local_1c != -1) {
    eltype = (**(code **)(*(long *)&(this->
                                    super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>
                                    ).super_TPZGeoEl + 0xb8))(this);
    p_Var1 = (_List_node_base *)TPZRefPatternDataBase::RefPatternList_abi_cxx11_(&gRefDBase,eltype);
    p_Var2 = p_Var1;
    do {
      p_Var2 = (((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var2 == p_Var1) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/tpzgeoelrefpattern.h.h"
                   ,0x21);
      }
    } while (*(int *)(*(long *)p_Var2[1]._M_next + 0x68) != local_1c);
    TPZAutoPointer<TPZRefPattern>::operator=
              (&this->fRefPattern,(TPZAutoPointer<TPZRefPattern> *)(p_Var2 + 1));
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Read(TPZStream &str, void *context) {
    TPZGeoElRefLess<TGeo>::Read(str, context);
    str.Read(this->fSubEl);
    int refpatternindex;
    str.Read(&refpatternindex, 1);
    if (refpatternindex != -1) {
        const std::list< TPZAutoPointer<TPZRefPattern> > &RefPatternList = gRefDBase.RefPatternList(this->Type());
        std::list< TPZAutoPointer<TPZRefPattern> >::const_iterator it;

        for (it = RefPatternList.begin(); it != RefPatternList.end(); it++) {
            if ((*it)->Id() == refpatternindex) {
                break;
            }
        }

        if (it != RefPatternList.end()) {
            fRefPattern = *it;
        } else {
            DebugStop();
        }
    }
}